

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

shared<boost::ext::di::v1_3_0::scopes::singleton,_empty,_std::shared_ptr<empty>_&> __thiscall
boost::ext::di::v1_3_0::scopes::singleton::
scope_impl<empty,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
create_impl<empty,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (scope_impl<empty,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_> *this,
          provider<boost::ext::di::v1_3_0::aux::pair<empty,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
          *provider)

{
  int iVar1;
  empty *__p;
  shared_ptr<empty> *in_stack_ffffffffffffffd0;
  heap *in_stack_ffffffffffffffd8;
  provider<boost::ext::di::v1_3_0::aux::pair<empty,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  if (create_impl<empty,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
      ::object == '\0') {
    iVar1 = __cxa_guard_acquire(&create_impl<empty,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
                                 ::object);
    if (iVar1 != 0) {
      __p = core::successful::
            provider<boost::ext::di::v1_3_0::aux::pair<empty,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
            ::get<boost::ext::di::v1_3_0::type_traits::heap>
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      std::shared_ptr<empty>::shared_ptr<empty,void>(in_stack_ffffffffffffffd0,__p);
      __cxa_atexit(std::shared_ptr<empty>::~shared_ptr,
                   &scope_impl<empty,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
                    create_impl<empty,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
                    ::object,&__dso_handle);
      __cxa_guard_release(&create_impl<empty,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
                           ::object);
    }
  }
  return (shared<boost::ext::di::v1_3_0::scopes::singleton,_empty,_std::shared_ptr<empty>_&>)
         &scope_impl<empty,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
          create_impl<empty,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
          ::object;
}

Assistant:

auto create_impl(const TProvider& provider) {
      static std::shared_ptr<T_> object{provider.get()};
      return wrappers::shared<singleton, T_, std::shared_ptr<T_>&>{object};
    }